

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

JavascriptString *
Js::JavascriptArray::ToLocaleString<Js::RecyclableObject>
          (RecyclableObject *arr,ScriptContext *scriptContext)

{
  bool bVar1;
  uint32 uVar2;
  BOOL BVar3;
  TypedArrayBase *pTVar4;
  anon_class_48_6_399da0b0 local_b0;
  anon_class_24_3_633237ca local_80;
  JavascriptArray *local_68;
  RecyclableObject *arr_local;
  JavascriptString *res;
  JsReentLock jsReentLock;
  ScriptContext *scriptContext_local;
  bool pushedObject;
  
  res = (JavascriptString *)scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)res)->noJsReentrancy;
  ((ThreadContext *)res)->noJsReentrancy = true;
  local_68 = (JavascriptArray *)arr;
  jsReentLock._24_8_ = scriptContext;
  JsReentLock::setObjectForMutation((JsReentLock *)&res,arr);
  bVar1 = VarIsImpl<Js::TypedArrayBase>(arr);
  if (bVar1) {
    pTVar4 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(arr);
    if (pTVar4 == (TypedArrayBase *)0x0) goto LAB_00a6184f;
    uVar2 = (pTVar4->super_ArrayBufferParent).super_ArrayObject.length;
    scriptContext_local._0_4_ = uVar2;
  }
  else {
LAB_00a6184f:
    *(undefined1 *)&res[8].super_RecyclableObject.type.ptr = jsReentLock.m_arrayObject2._0_1_;
    uVar2 = ItemTrace<Js::RecyclableObject>::GetLength(arr,scriptContext);
    scriptContext_local._0_4_ = uVar2;
    JsReentLock::MutateArrayObject((JsReentLock *)&res);
    *(undefined1 *)&res[8].super_RecyclableObject.type.ptr = 1;
  }
  if (uVar2 != 0) {
    BVar3 = ScriptContext::CheckObject(scriptContext,arr);
    if (BVar3 == 0) {
      arr_local = &JavascriptLibrary::GetEmptyString
                             ((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                   super_RecyclableObject;
      local_b0.res = (JavascriptString **)&arr_local;
      local_b0.pushedObject = (bool *)((long)&scriptContext_local + 7);
      scriptContext_local._7_1_ = 0;
      local_b0.scriptContext = (ScriptContext **)&jsReentLock.m_savedNoJsReentrancy;
      local_b0.arr = (RecyclableObject **)&local_68;
      local_b0.length = (uint32 *)&scriptContext_local;
      local_b0.jsReentLock = (JsReentLock *)&res;
      local_80.pushedObject = local_b0.pushedObject;
      local_80.scriptContext = local_b0.scriptContext;
      local_80.arr = (JavascriptArray **)local_b0.arr;
      TryFinally<Js::JavascriptArray::ToLocaleString<Js::RecyclableObject>(Js::RecyclableObject*,Js::ScriptContext*)::_lambda()_1_,Js::JavascriptArray::ToLocaleString<Js::RecyclableObject>(Js::RecyclableObject*,Js::ScriptContext*)::_lambda(bool)_1_>
                (&local_b0,&local_80);
      if (arr_local == (RecyclableObject *)0x0) {
        arr_local = &JavascriptLibrary::GetEmptyString
                               (*(JavascriptLibrary **)(jsReentLock._24_8_ + 8))->
                     super_RecyclableObject;
      }
      goto LAB_00a6189e;
    }
  }
  arr_local = &JavascriptLibrary::GetEmptyString
                         ((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_RecyclableObject;
LAB_00a6189e:
  *(undefined1 *)&res[8].super_RecyclableObject.type.ptr = jsReentLock.m_arrayObject2._0_1_;
  return (JavascriptString *)arr_local;
}

Assistant:

JavascriptString* JavascriptArray::ToLocaleString(T* arr, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, arr);

        uint32 length = 0;
        TypedArrayBase * typedArray = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(static_cast<RecyclableObject*>(arr));
        if (typedArray)
        {
            // For a TypedArray use the actual length of the array.
            length = typedArray->GetLength();
        }
        else
        {
            //For anything else, use the "length" property if present.
            JS_REENTRANT(jsReentLock, length = ItemTrace<T>::GetLength(arr, scriptContext));
        }

        if (length == 0 || scriptContext->CheckObject(arr))
        {
            return scriptContext->GetLibrary()->GetEmptyString();
        }

        JavascriptString* res = scriptContext->GetLibrary()->GetEmptyString();
        bool pushedObject = false;

        TryFinally([&]()
        {
            scriptContext->PushObject(arr);
            pushedObject = true;

            Var element;
            JS_REENTRANT(jsReentLock, BOOL gotItem = ItemTrace<T>::GetItem(arr, 0, &element, scriptContext));
            if (gotItem)
            {
                JS_REENTRANT(jsReentLock, res = JavascriptArray::ToLocaleStringHelper(element, scriptContext));
            }

            if (length > 1)
            {
                uint32 sepSize = 0;
                char16 szSeparator[Arrays::SeparatorBufferSize];

                bool hasLocaleSeparator = Arrays::GetLocaleSeparator(szSeparator, &sepSize, Arrays::SeparatorBufferSize);

                JavascriptString* separator = nullptr;

                if (hasLocaleSeparator)
                {
                    separator = JavascriptString::NewCopyBuffer(szSeparator, static_cast<charcount_t>(sepSize), scriptContext);
                }
                else
                {
                    separator = scriptContext->GetLibrary()->GetCommaDisplayString();
                }

                for (uint32 i = 1; i < length; i++)
                {
                    res = JavascriptString::Concat(res, separator);
                    JS_REENTRANT(jsReentLock, gotItem = ItemTrace<T>::GetItem(arr, i, &element, scriptContext));
                    if (gotItem)
                    {
                        JS_REENTRANT(jsReentLock, res = JavascriptString::Concat(res, JavascriptArray::ToLocaleStringHelper(element, scriptContext)));
                    }
                }
            }
        },
        [&](bool/*hasException*/)
        {
            if (pushedObject)
            {
                Var top = scriptContext->PopObject();
                AssertMsg(top == arr, "Unmatched operation stack");
            }
        });

        if (res == nullptr)
        {
            res = scriptContext->GetLibrary()->GetEmptyString();
        }

        return res;
    }